

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_iarchive.h
# Opt level: O3

size_type __thiscall serialization::xml_iarchive::load_sequence_start(xml_iarchive *this)

{
  iterator *piVar1;
  _Elt_pointer ppxVar2;
  xml_node<char> *this_00;
  xml_attribute<char> *pxVar3;
  ulonglong uVar4;
  undefined8 *puVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  xml_node<char> *node;
  char *end;
  xml_node<char> *local_40;
  char *local_38;
  
  ppxVar2 = (this->stack_).c.
            super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppxVar2 ==
      (this->stack_).c.
      super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppxVar2 = (this->stack_).c.
              super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  this_00 = rapidxml::xml_node<char>::first_node(ppxVar2[-1],"sequence",0,true);
  local_40 = this_00;
  if (this_00 == (xml_node<char> *)0x0) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x18);
    *puVar5 = &PTR__exception_00120d50;
    pcVar7 = "expect sequence";
  }
  else {
    pxVar3 = rapidxml::xml_node<char>::first_attribute(this_00,"size",0,true);
    if (pxVar3 == (xml_attribute<char> *)0x0) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x18);
      *puVar5 = &PTR__exception_00120d50;
      pcVar7 = "expect sequence size";
    }
    else {
      local_38 = (pxVar3->super_xml_base<char>).m_value;
      if (local_38 == (char *)0x0) {
        local_38 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      uVar4 = strtoull(local_38,&local_38,10);
      pcVar7 = (pxVar3->super_xml_base<char>).m_value;
      pcVar6 = pcVar7;
      pcVar8 = &rapidxml::xml_base<char>::nullstr()::zero;
      if (pcVar7 != (char *)0x0) {
        pcVar6 = (char *)(pxVar3->super_xml_base<char>).m_value_size;
        pcVar8 = pcVar7;
      }
      if (local_38 + -(long)pcVar8 == pcVar6) {
        ppxVar2 = (this->stack_).c.
                  super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (ppxVar2 ==
            (this->stack_).c.
            super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<rapidxml::xml_node<char>const*,std::allocator<rapidxml::xml_node<char>const*>>
          ::_M_push_back_aux<rapidxml::xml_node<char>const*const&>
                    ((deque<rapidxml::xml_node<char>const*,std::allocator<rapidxml::xml_node<char>const*>>
                      *)&this->stack_,&local_40);
          ppxVar2 = (this->stack_).c.
                    super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        }
        else {
          *ppxVar2 = this_00;
          ppxVar2 = (this->stack_).c.
                    super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          (this->stack_).c.
          super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur = ppxVar2;
        }
        if ((size_type)uVar4 == 0) {
          local_40 = (xml_node<char> *)0x0;
        }
        else {
          if (ppxVar2 ==
              (this->stack_).c.
              super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppxVar2 = (this->stack_).c.
                      super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          local_40 = rapidxml::xml_node<char>::first_node(ppxVar2[-1],"item",0,true);
          ppxVar2 = (this->stack_).c.
                    super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        }
        if (ppxVar2 ==
            (this->stack_).c.
            super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<rapidxml::xml_node<char>const*,std::allocator<rapidxml::xml_node<char>const*>>
          ::_M_push_back_aux<rapidxml::xml_node<char>const*const&>
                    ((deque<rapidxml::xml_node<char>const*,std::allocator<rapidxml::xml_node<char>const*>>
                      *)&this->stack_,&local_40);
        }
        else {
          *ppxVar2 = local_40;
          piVar1 = &(this->stack_).c.
                    super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
        return (size_type)uVar4;
      }
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x18);
      *puVar5 = &PTR__exception_00120d50;
      pcVar7 = "bad sequence size";
    }
  }
  puVar5[1] = pcVar7;
  puVar5[2] = "load_sequence_start";
  __cxa_throw(puVar5,&serialization_error::typeinfo,std::exception::~exception);
}

Assistant:

size_type load_sequence_start() const
    {
        serialization_trace trace(__func__, "xml");
        auto node = stack_.top()->first_node("sequence");
        if(node == nullptr)
        {
            throw_serialization_error(__func__, "expect sequence");
        }
        auto attr = node->first_attribute("size");
        if(attr == nullptr)
        {
            throw_serialization_error(__func__, "expect sequence size");
        }

        char *end = attr->value();
        size_type size = std::strtoull(attr->value(), &end, 10);
        if(end - attr->value() != attr->value_size())
        {
            throw_serialization_error(__func__, "bad sequence size");
        }

        stack_.push(node);
        node = (size == 0 ? nullptr : stack_.top()->first_node("item"));
        stack_.push(node);

        return size;
    }